

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook.c
# Opt level: O3

int al_for_each_fs_entry
              (ALLEGRO_FS_ENTRY *dir,_func_int_ALLEGRO_FS_ENTRY_ptr_void_ptr *callback,void *extra)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  ALLEGRO_FS_ENTRY *dir_00;
  int unaff_EBX;
  int iVar4;
  
  if ((dir == (ALLEGRO_FS_ENTRY *)0x0) || (_Var1 = (*dir->vtable->fs_open_directory)(dir), !_Var1))
  {
    al_set_errno(2);
    iVar2 = -1;
  }
  else {
    dir_00 = (*dir->vtable->fs_read_directory)(dir);
    while (dir_00 != (ALLEGRO_FS_ENTRY *)0x0) {
      iVar2 = (*callback)(dir_00,extra);
      if (iVar2 == 0) {
        uVar3 = (*dir_00->vtable->fs_entry_mode)(dir_00);
        if ((uVar3 & 0x20) != 0) {
          iVar2 = al_for_each_fs_entry(dir_00,callback,extra);
          goto LAB_0015aca2;
        }
        (*dir_00->vtable->fs_destroy_entry)(dir_00);
        iVar4 = unaff_EBX;
      }
      else {
LAB_0015aca2:
        (*dir_00->vtable->fs_destroy_entry)(dir_00);
        iVar4 = iVar2;
        if ((iVar2 != -1) && (iVar2 != 2)) {
          iVar4 = unaff_EBX;
        }
        if (iVar2 == -1) {
          return iVar4;
        }
        if (iVar2 == 2) {
          return iVar4;
        }
      }
      dir_00 = (*dir->vtable->fs_read_directory)(dir);
      unaff_EBX = iVar4;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int al_for_each_fs_entry(ALLEGRO_FS_ENTRY *dir,
                         int (*callback)(ALLEGRO_FS_ENTRY *dir, void *extra),
                         void *extra)
{
   ALLEGRO_FS_ENTRY *entry;

   if (!dir || !al_open_directory(dir)) {
      al_set_errno(ENOENT);
      return ALLEGRO_FOR_EACH_FS_ENTRY_ERROR;
   }
   
   for (entry = al_read_directory(dir); entry; entry = al_read_directory(dir)) {
      /* Call the callback first. */
      int result = callback(entry, extra);
      
      /* Recurse if requested and needed. Only OK allows recursion. */
      if (result == ALLEGRO_FOR_EACH_FS_ENTRY_OK) {
         if (al_get_fs_entry_mode(entry) & ALLEGRO_FILEMODE_ISDIR) {
            result = al_for_each_fs_entry(entry, callback, extra);
         }
      }

      al_destroy_fs_entry(entry);
      
      if ((result == ALLEGRO_FOR_EACH_FS_ENTRY_STOP) ||
         (result == ALLEGRO_FOR_EACH_FS_ENTRY_ERROR)) {
         return result;
      }
   }
   
   return ALLEGRO_FOR_EACH_FS_ENTRY_OK;
}